

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O3

void __thiscall QFile::setFileName(QFile *this,QString *name)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  bool bVar3;
  
  pQVar1 = (this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  bVar3 = QIODevice::isOpen((QIODevice *)this);
  if (bVar3) {
    setFileName(this);
  }
  pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
  pQVar1[4].bindingStorage.bindingStatus = (QBindingStatus *)0x0;
  if (pQVar2 != (QBindingStatus *)0x0) {
    (*(code *)pQVar2->currentlyEvaluatingBinding->previousState)();
  }
  QString::operator=((QString *)&pQVar1[5].children,name);
  return;
}

Assistant:

void
QFile::setFileName(const QString &name)
{
    Q_D(QFile);
    if (isOpen()) {
        file_already_open(*this, "setFileName");
        close();
    }
    d->fileEngine.reset(); //get a new file engine later
    d->fileName = name;
}